

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O3

bool __thiscall
wasm::ShellExternalInterface::growTable
          (ShellExternalInterface *this,Name name,Literal *value,Index param_3,Index newSize)

{
  mapped_type *this_00;
  undefined1 local_28 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_28 = name.super_IString.str._M_len;
  if (newSize < 0x40000001) {
    this_00 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->tables,(key_type *)local_28);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::resize(this_00,(ulong)newSize,value)
    ;
  }
  return newSize < 0x40000001;
}

Assistant:

bool growTable(Name name,
                 const Literal& value,
                 Index /*oldSize*/,
                 Index newSize) override {
    // Apply a reasonable limit on table size, 1GB, to avoid DOS on the
    // interpreter.
    if (newSize > 1024 * 1024 * 1024) {
      return false;
    }
    tables[name].resize(newSize, value);
    return true;
  }